

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

size_t mbedtls_mpi_lsb(mbedtls_mpi *X)

{
  size_t local_30;
  size_t count;
  size_t j;
  size_t i;
  mbedtls_mpi *X_local;
  
  local_30 = 0;
  j = 0;
  do {
    if (X->n <= j) {
      return 0;
    }
    for (count = 0; count < 0x40; count = count + 1) {
      if ((X->p[j] >> ((byte)count & 0x3f) & 1) != 0) {
        return local_30;
      }
      local_30 = local_30 + 1;
    }
    j = j + 1;
  } while( true );
}

Assistant:

size_t mbedtls_mpi_lsb( const mbedtls_mpi *X )
{
    size_t i, j, count = 0;
    MBEDTLS_INTERNAL_VALIDATE_RET( X != NULL, 0 );

    for( i = 0; i < X->n; i++ )
        for( j = 0; j < biL; j++, count++ )
            if( ( ( X->p[i] >> j ) & 1 ) != 0 )
                return( count );

    return( 0 );
}